

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

vector<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_> * __thiscall
bloaty::DualMaps::VmMaps
          (vector<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_>
           *__return_storage_ptr__,DualMaps *this)

{
  pointer puVar1;
  unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_> *map;
  pointer puVar2;
  _Head_base<0UL,_bloaty::DualMap_*,_false> local_28;
  
  (__return_storage_ptr__->
  super__Vector_base<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar1 = (this->maps_).
           super__Vector_base<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->maps_).
                super__Vector_base<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    local_28._M_head_impl =
         (puVar2->_M_t).
         super___uniq_ptr_impl<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>._M_t.
         super__Tuple_impl<0UL,_bloaty::DualMap_*,_std::default_delete<bloaty::DualMap>_>.
         super__Head_base<0UL,_bloaty::DualMap_*,_false>._M_head_impl;
    std::vector<bloaty::RangeMap_const*,std::allocator<bloaty::RangeMap_const*>>::
    emplace_back<bloaty::RangeMap_const*>
              ((vector<bloaty::RangeMap_const*,std::allocator<bloaty::RangeMap_const*>> *)
               __return_storage_ptr__,(RangeMap **)&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const RangeMap*> VmMaps() const {
    std::vector<const RangeMap*> ret;
    for (const auto& map : maps_) {
      ret.push_back(&map->vm_map);
    }
    return ret;
  }